

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmContinueCommand.cxx
# Opt level: O0

bool __thiscall
cmContinueCommand::InitialPass
          (cmContinueCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  bool bVar2;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmContinueCommand *this_local;
  
  local_28 = status;
  status_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar2 = cmMakefile::IsLoopBlock((this->super_cmCommand).Makefile);
  if (bVar2) {
    cmExecutionStatus::SetContinueInvoked(local_28);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local);
    if (!bVar2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"The CONTINUE command does not accept any arguments.",&local_81
                );
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      cmSystemTools::SetFatalErrorOccured();
    }
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "A CONTINUE command was found outside of a proper FOREACH or WHILE loop scope.",
               &local_49);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    cmSystemTools::SetFatalErrorOccured();
  }
  return true;
}

Assistant:

bool cmContinueCommand::InitialPass(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  if (!this->Makefile->IsLoopBlock()) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "A CONTINUE command was found outside of a "
                                 "proper FOREACH or WHILE loop scope.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }

  status.SetContinueInvoked();

  if (!args.empty()) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 "The CONTINUE command does not accept any "
                                 "arguments.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }

  return true;
}